

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_utils.h
# Opt level: O2

void transpose16x16_sse2(__m128i *x,__m128i *d)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  undefined1 auVar17 [14];
  undefined1 auVar18 [12];
  unkbyte10 Var19;
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  unkbyte10 Var22;
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  unkbyte10 Var28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  longlong lVar33;
  undefined2 uVar34;
  undefined4 uVar35;
  undefined1 auVar40 [12];
  undefined1 auVar42 [16];
  undefined2 uVar53;
  undefined4 uVar54;
  undefined1 auVar59 [12];
  undefined1 auVar61 [16];
  undefined2 uVar72;
  undefined4 uVar73;
  undefined1 auVar78 [12];
  undefined1 auVar80 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined2 uVar93;
  undefined1 auVar99 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined2 uVar109;
  undefined1 auVar115 [16];
  undefined2 uVar123;
  undefined1 auVar127 [12];
  undefined1 auVar129 [12];
  undefined1 auVar131 [16];
  undefined2 uVar142;
  undefined1 auVar148 [16];
  undefined2 uVar156;
  undefined1 auVar162 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined6 uVar36;
  undefined1 auVar43 [16];
  undefined1 auVar38 [12];
  undefined8 uVar37;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar39 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar41 [14];
  undefined1 auVar52 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined6 uVar55;
  undefined1 auVar62 [16];
  undefined1 auVar57 [12];
  undefined8 uVar56;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar58 [12];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar60 [14];
  undefined1 auVar71 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined6 uVar74;
  undefined1 auVar81 [16];
  undefined1 auVar76 [12];
  undefined8 uVar75;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar77 [12];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar79 [14];
  undefined1 auVar91 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined4 uVar94;
  undefined6 uVar95;
  undefined8 uVar96;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar97 [12];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar98 [14];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined4 uVar110;
  undefined6 uVar111;
  undefined8 uVar112;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar113 [12];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar114 [14];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined4 uVar124;
  undefined6 uVar125;
  undefined1 auVar132 [16];
  undefined8 uVar126;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar128 [12];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar130 [14];
  undefined1 auVar141 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar140 [16];
  undefined4 uVar143;
  undefined6 uVar144;
  undefined8 uVar145;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar146 [12];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar147 [14];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined4 uVar157;
  undefined6 uVar158;
  undefined8 uVar159;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar160 [12];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar161 [14];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar171 [16];
  undefined1 auVar177 [16];
  undefined1 auVar172 [16];
  undefined1 auVar178 [16];
  undefined1 auVar173 [16];
  undefined1 auVar179 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar181 [16];
  undefined1 auVar187 [16];
  undefined1 auVar182 [16];
  undefined1 auVar188 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar191 [16];
  undefined1 auVar197 [16];
  undefined1 auVar192 [16];
  undefined1 auVar198 [16];
  undefined1 auVar193 [16];
  undefined1 auVar199 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar201 [16];
  undefined1 auVar206 [16];
  undefined1 auVar202 [16];
  undefined1 auVar207 [16];
  
  alVar1 = *x;
  alVar2 = x[2];
  alVar3 = x[4];
  alVar4 = x[6];
  auVar49._0_14_ = alVar1._0_14_;
  auVar49[0xe] = alVar1[0]._7_1_;
  auVar49[0xf] = *(undefined1 *)((long)x[1] + 7);
  auVar48._14_2_ = auVar49._14_2_;
  auVar48._0_13_ = alVar1._0_13_;
  auVar48[0xd] = *(undefined1 *)((long)x[1] + 6);
  auVar47._13_3_ = auVar48._13_3_;
  auVar47._0_12_ = alVar1._0_12_;
  auVar47[0xc] = alVar1[0]._6_1_;
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_11_ = alVar1._0_11_;
  auVar46[0xb] = *(undefined1 *)((long)x[1] + 5);
  auVar45._11_5_ = auVar46._11_5_;
  auVar45._0_10_ = alVar1._0_10_;
  auVar45[10] = alVar1[0]._5_1_;
  auVar44._10_6_ = auVar45._10_6_;
  auVar44._0_9_ = alVar1._0_9_;
  auVar44[9] = *(undefined1 *)((long)x[1] + 4);
  auVar43._9_7_ = auVar44._9_7_;
  auVar43._0_8_ = alVar1[0];
  auVar43[8] = alVar1[0]._4_1_;
  Var7 = CONCAT91(CONCAT81(auVar43._8_8_,*(undefined1 *)((long)x[1] + 3)),alVar1[0]._3_1_);
  auVar6._2_10_ = Var7;
  auVar6[1] = *(undefined1 *)((long)x[1] + 2);
  auVar6[0] = alVar1[0]._2_1_;
  auVar5._2_12_ = auVar6;
  auVar5[1] = *(undefined1 *)((long)x[1] + 1);
  auVar5[0] = alVar1[0]._1_1_;
  auVar42._0_2_ = CONCAT11((char)x[1][0],(char)alVar1[0]);
  auVar42._2_14_ = auVar5;
  auVar105._0_14_ = alVar2._0_14_;
  auVar105[0xe] = alVar2[0]._7_1_;
  auVar105[0xf] = *(undefined1 *)((long)x[3] + 7);
  auVar104._14_2_ = auVar105._14_2_;
  auVar104._0_13_ = alVar2._0_13_;
  auVar104[0xd] = *(undefined1 *)((long)x[3] + 6);
  auVar103._13_3_ = auVar104._13_3_;
  auVar103._0_12_ = alVar2._0_12_;
  auVar103[0xc] = alVar2[0]._6_1_;
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_11_ = alVar2._0_11_;
  auVar102[0xb] = *(undefined1 *)((long)x[3] + 5);
  auVar101._11_5_ = auVar102._11_5_;
  auVar101._0_10_ = alVar2._0_10_;
  auVar101[10] = alVar2[0]._5_1_;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._0_9_ = alVar2._0_9_;
  auVar100[9] = *(undefined1 *)((long)x[3] + 4);
  auVar99._9_7_ = auVar100._9_7_;
  auVar99._0_8_ = alVar2[0];
  auVar99[8] = alVar2[0]._4_1_;
  Var10 = CONCAT91(CONCAT81(auVar99._8_8_,*(undefined1 *)((long)x[3] + 3)),alVar2[0]._3_1_);
  auVar9._2_10_ = Var10;
  auVar9[1] = *(undefined1 *)((long)x[3] + 2);
  auVar9[0] = alVar2[0]._2_1_;
  auVar8._2_12_ = auVar9;
  auVar8[1] = *(undefined1 *)((long)x[3] + 1);
  auVar8[0] = alVar2[0]._1_1_;
  auVar87._0_14_ = alVar3._0_14_;
  auVar87[0xe] = alVar3[0]._7_1_;
  auVar87[0xf] = *(undefined1 *)((long)x[5] + 7);
  auVar86._14_2_ = auVar87._14_2_;
  auVar86._0_13_ = alVar3._0_13_;
  auVar86[0xd] = *(undefined1 *)((long)x[5] + 6);
  auVar85._13_3_ = auVar86._13_3_;
  auVar85._0_12_ = alVar3._0_12_;
  auVar85[0xc] = alVar3[0]._6_1_;
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._0_11_ = alVar3._0_11_;
  auVar84[0xb] = *(undefined1 *)((long)x[5] + 5);
  auVar83._11_5_ = auVar84._11_5_;
  auVar83._0_10_ = alVar3._0_10_;
  auVar83[10] = alVar3[0]._5_1_;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._0_9_ = alVar3._0_9_;
  auVar82[9] = *(undefined1 *)((long)x[5] + 4);
  auVar81._9_7_ = auVar82._9_7_;
  auVar81._0_8_ = alVar3[0];
  auVar81[8] = alVar3[0]._4_1_;
  Var13 = CONCAT91(CONCAT81(auVar81._8_8_,*(undefined1 *)((long)x[5] + 3)),alVar3[0]._3_1_);
  auVar12._2_10_ = Var13;
  auVar12[1] = *(undefined1 *)((long)x[5] + 2);
  auVar12[0] = alVar3[0]._2_1_;
  auVar11._2_12_ = auVar12;
  auVar11[1] = *(undefined1 *)((long)x[5] + 1);
  auVar11[0] = alVar3[0]._1_1_;
  auVar80._0_2_ = CONCAT11((char)x[5][0],(char)alVar3[0]);
  auVar80._2_14_ = auVar11;
  auVar121._0_14_ = alVar4._0_14_;
  auVar121[0xe] = alVar4[0]._7_1_;
  auVar121[0xf] = *(undefined1 *)((long)x[7] + 7);
  auVar120._14_2_ = auVar121._14_2_;
  auVar120._0_13_ = alVar4._0_13_;
  auVar120[0xd] = *(undefined1 *)((long)x[7] + 6);
  auVar119._13_3_ = auVar120._13_3_;
  auVar119._0_12_ = alVar4._0_12_;
  auVar119[0xc] = alVar4[0]._6_1_;
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._0_11_ = alVar4._0_11_;
  auVar118[0xb] = *(undefined1 *)((long)x[7] + 5);
  auVar117._11_5_ = auVar118._11_5_;
  auVar117._0_10_ = alVar4._0_10_;
  auVar117[10] = alVar4[0]._5_1_;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._0_9_ = alVar4._0_9_;
  auVar116[9] = *(undefined1 *)((long)x[7] + 4);
  auVar115._9_7_ = auVar116._9_7_;
  auVar115._0_8_ = alVar4[0];
  auVar115[8] = alVar4[0]._4_1_;
  Var16 = CONCAT91(CONCAT81(auVar115._8_8_,*(undefined1 *)((long)x[7] + 3)),alVar4[0]._3_1_);
  auVar15._2_10_ = Var16;
  auVar15[1] = *(undefined1 *)((long)x[7] + 2);
  auVar15[0] = alVar4[0]._2_1_;
  auVar14._2_12_ = auVar15;
  auVar14[1] = *(undefined1 *)((long)x[7] + 1);
  auVar14[0] = alVar4[0]._1_1_;
  alVar1 = x[8];
  auVar68._0_14_ = alVar1._0_14_;
  auVar68[0xe] = alVar1[0]._7_1_;
  auVar68[0xf] = *(undefined1 *)((long)x[9] + 7);
  auVar67._14_2_ = auVar68._14_2_;
  auVar67._0_13_ = alVar1._0_13_;
  auVar67[0xd] = *(undefined1 *)((long)x[9] + 6);
  auVar66._13_3_ = auVar67._13_3_;
  auVar66._0_12_ = alVar1._0_12_;
  auVar66[0xc] = alVar1[0]._6_1_;
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._0_11_ = alVar1._0_11_;
  auVar65[0xb] = *(undefined1 *)((long)x[9] + 5);
  auVar64._11_5_ = auVar65._11_5_;
  auVar64._0_10_ = alVar1._0_10_;
  auVar64[10] = alVar1[0]._5_1_;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._0_9_ = alVar1._0_9_;
  auVar63[9] = *(undefined1 *)((long)x[9] + 4);
  auVar62._9_7_ = auVar63._9_7_;
  auVar62._0_8_ = alVar1[0];
  auVar62[8] = alVar1[0]._4_1_;
  Var19 = CONCAT91(CONCAT81(auVar62._8_8_,*(undefined1 *)((long)x[9] + 3)),alVar1[0]._3_1_);
  auVar18._2_10_ = Var19;
  auVar18[1] = *(undefined1 *)((long)x[9] + 2);
  auVar18[0] = alVar1[0]._2_1_;
  auVar17._2_12_ = auVar18;
  auVar17[1] = *(undefined1 *)((long)x[9] + 1);
  auVar17[0] = alVar1[0]._1_1_;
  auVar61._0_2_ = CONCAT11((char)x[9][0],(char)alVar1[0]);
  auVar61._2_14_ = auVar17;
  alVar1 = x[10];
  auVar154._0_14_ = alVar1._0_14_;
  auVar154[0xe] = alVar1[0]._7_1_;
  auVar154[0xf] = *(undefined1 *)((long)x[0xb] + 7);
  auVar153._14_2_ = auVar154._14_2_;
  auVar153._0_13_ = alVar1._0_13_;
  auVar153[0xd] = *(undefined1 *)((long)x[0xb] + 6);
  auVar152._13_3_ = auVar153._13_3_;
  auVar152._0_12_ = alVar1._0_12_;
  auVar152[0xc] = alVar1[0]._6_1_;
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_11_ = alVar1._0_11_;
  auVar151[0xb] = *(undefined1 *)((long)x[0xb] + 5);
  auVar150._11_5_ = auVar151._11_5_;
  auVar150._0_10_ = alVar1._0_10_;
  auVar150[10] = alVar1[0]._5_1_;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._0_9_ = alVar1._0_9_;
  auVar149[9] = *(undefined1 *)((long)x[0xb] + 4);
  auVar148._9_7_ = auVar149._9_7_;
  auVar148._0_8_ = alVar1[0];
  auVar148[8] = alVar1[0]._4_1_;
  Var22 = CONCAT91(CONCAT81(auVar148._8_8_,*(undefined1 *)((long)x[0xb] + 3)),alVar1[0]._3_1_);
  auVar21._2_10_ = Var22;
  auVar21[1] = *(undefined1 *)((long)x[0xb] + 2);
  auVar21[0] = alVar1[0]._2_1_;
  auVar20._2_12_ = auVar21;
  auVar20[1] = *(undefined1 *)((long)x[0xb] + 1);
  auVar20[0] = alVar1[0]._1_1_;
  alVar3 = x[0xc];
  auVar138._0_14_ = alVar3._0_14_;
  auVar138[0xe] = alVar3[0]._7_1_;
  auVar138[0xf] = *(undefined1 *)((long)x[0xd] + 7);
  auVar137._14_2_ = auVar138._14_2_;
  auVar137._0_13_ = alVar3._0_13_;
  auVar137[0xd] = *(undefined1 *)((long)x[0xd] + 6);
  auVar136._13_3_ = auVar137._13_3_;
  auVar136._0_12_ = alVar3._0_12_;
  auVar136[0xc] = alVar3[0]._6_1_;
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._0_11_ = alVar3._0_11_;
  auVar135[0xb] = *(undefined1 *)((long)x[0xd] + 5);
  auVar134._11_5_ = auVar135._11_5_;
  auVar134._0_10_ = alVar3._0_10_;
  auVar134[10] = alVar3[0]._5_1_;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._0_9_ = alVar3._0_9_;
  auVar133[9] = *(undefined1 *)((long)x[0xd] + 4);
  auVar132._9_7_ = auVar133._9_7_;
  auVar132._0_8_ = alVar3[0];
  auVar132[8] = alVar3[0]._4_1_;
  Var25 = CONCAT91(CONCAT81(auVar132._8_8_,*(undefined1 *)((long)x[0xd] + 3)),alVar3[0]._3_1_);
  auVar24._2_10_ = Var25;
  auVar24[1] = *(undefined1 *)((long)x[0xd] + 2);
  auVar24[0] = alVar3[0]._2_1_;
  auVar23._2_12_ = auVar24;
  auVar23[1] = *(undefined1 *)((long)x[0xd] + 1);
  auVar23[0] = alVar3[0]._1_1_;
  auVar131._0_2_ = CONCAT11((char)x[0xd][0],(char)alVar3[0]);
  auVar131._2_14_ = auVar23;
  alVar3 = x[0xe];
  lVar33 = x[0xf][0];
  auVar168._0_14_ = alVar3._0_14_;
  auVar168[0xe] = alVar3[0]._7_1_;
  auVar168[0xf] = *(undefined1 *)((long)x[0xf] + 7);
  auVar167._14_2_ = auVar168._14_2_;
  auVar167._0_13_ = alVar3._0_13_;
  auVar167[0xd] = *(undefined1 *)((long)x[0xf] + 6);
  auVar166._13_3_ = auVar167._13_3_;
  auVar166._0_12_ = alVar3._0_12_;
  auVar166[0xc] = alVar3[0]._6_1_;
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._0_11_ = alVar3._0_11_;
  auVar165[0xb] = *(undefined1 *)((long)x[0xf] + 5);
  auVar164._11_5_ = auVar165._11_5_;
  auVar164._0_10_ = alVar3._0_10_;
  auVar164[10] = alVar3[0]._5_1_;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._0_9_ = alVar3._0_9_;
  auVar163[9] = *(undefined1 *)((long)x[0xf] + 4);
  auVar162._9_7_ = auVar163._9_7_;
  auVar162._0_8_ = alVar3[0];
  auVar162[8] = alVar3[0]._4_1_;
  Var28 = CONCAT91(CONCAT81(auVar162._8_8_,*(undefined1 *)((long)x[0xf] + 3)),alVar3[0]._3_1_);
  auVar27._2_10_ = Var28;
  auVar27[1] = *(undefined1 *)((long)x[0xf] + 2);
  auVar27[0] = alVar3[0]._2_1_;
  auVar26._2_12_ = auVar27;
  auVar26[1] = *(undefined1 *)((long)x[0xf] + 1);
  auVar26[0] = alVar3[0]._1_1_;
  auVar173._0_12_ = auVar42._0_12_;
  auVar173._12_2_ = (short)Var7;
  auVar173._14_2_ = (short)Var10;
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._0_10_ = auVar42._0_10_;
  auVar172._10_2_ = auVar9._0_2_;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._0_8_ = auVar42._0_8_;
  auVar171._8_2_ = auVar6._0_2_;
  auVar29._4_8_ = auVar171._8_8_;
  auVar29._2_2_ = auVar8._0_2_;
  auVar29._0_2_ = auVar5._0_2_;
  auVar170._0_4_ = CONCAT22(CONCAT11((char)x[3][0],(char)alVar2[0]),auVar42._0_2_);
  auVar170._4_12_ = auVar29;
  auVar182._0_12_ = auVar80._0_12_;
  auVar182._12_2_ = (short)Var13;
  auVar182._14_2_ = (short)Var16;
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._0_10_ = auVar80._0_10_;
  auVar181._10_2_ = auVar15._0_2_;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._0_8_ = auVar80._0_8_;
  auVar180._8_2_ = auVar12._0_2_;
  auVar30._4_8_ = auVar180._8_8_;
  auVar30._2_2_ = auVar14._0_2_;
  auVar30._0_2_ = auVar11._0_2_;
  auVar193._0_12_ = auVar61._0_12_;
  auVar193._12_2_ = (short)Var19;
  auVar193._14_2_ = (short)Var22;
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._0_10_ = auVar61._0_10_;
  auVar192._10_2_ = auVar21._0_2_;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._0_8_ = auVar61._0_8_;
  auVar191._8_2_ = auVar18._0_2_;
  auVar31._4_8_ = auVar191._8_8_;
  auVar31._2_2_ = auVar20._0_2_;
  auVar31._0_2_ = auVar17._0_2_;
  auVar190._0_4_ = CONCAT22(CONCAT11((char)x[0xb][0],(char)alVar1[0]),auVar61._0_2_);
  auVar190._4_12_ = auVar31;
  auVar202._0_12_ = auVar131._0_12_;
  auVar202._12_2_ = (short)Var25;
  auVar202._14_2_ = (short)Var28;
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._0_10_ = auVar131._0_10_;
  auVar201._10_2_ = auVar27._0_2_;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._0_8_ = auVar131._0_8_;
  auVar200._8_2_ = auVar24._0_2_;
  auVar32._4_8_ = auVar200._8_8_;
  auVar32._2_2_ = auVar26._0_2_;
  auVar32._0_2_ = auVar23._0_2_;
  auVar208._0_8_ = auVar170._0_8_;
  auVar208._8_4_ = auVar29._0_4_;
  auVar208._12_4_ = auVar30._0_4_;
  auVar183._0_8_ = auVar190._0_8_;
  auVar183._8_4_ = auVar31._0_4_;
  auVar183._12_4_ = auVar32._0_4_;
  (*d)[0] = CONCAT44(CONCAT22(CONCAT11((char)x[7][0],(char)alVar4[0]),auVar80._0_2_),auVar170._0_4_)
  ;
  (*d)[1] = CONCAT44(CONCAT22(CONCAT11((char)lVar33,(char)alVar3[0]),auVar131._0_2_),auVar190._0_4_)
  ;
  d[1][0] = auVar208._8_8_;
  d[1][1] = auVar183._8_8_;
  *(int *)d[2] = auVar171._8_4_;
  *(int *)((long)d[2] + 4) = auVar180._8_4_;
  *(int *)(d[2] + 1) = auVar191._8_4_;
  *(int *)((long)d[2] + 0xc) = auVar200._8_4_;
  *(undefined4 *)(d[3] + 1) = auVar172._12_4_;
  *(undefined4 *)((long)d[3] + 0xc) = auVar181._12_4_;
  *(undefined4 *)d[4] = auVar192._12_4_;
  *(undefined4 *)((long)d[4] + 4) = auVar201._12_4_;
  uVar35 = CONCAT22(auVar99._8_2_,auVar43._8_2_);
  auVar38._0_8_ = CONCAT26(auVar101._10_2_,CONCAT24(auVar45._10_2_,uVar35));
  auVar38._8_2_ = auVar47._12_2_;
  auVar38._10_2_ = auVar103._12_2_;
  auVar50._12_2_ = auVar48._14_2_;
  auVar50._0_12_ = auVar38;
  auVar50._14_2_ = auVar104._14_2_;
  uVar73 = CONCAT22(auVar115._8_2_,auVar81._8_2_);
  auVar76._0_8_ = CONCAT26(auVar117._10_2_,CONCAT24(auVar83._10_2_,uVar73));
  auVar76._8_2_ = auVar85._12_2_;
  auVar76._10_2_ = auVar119._12_2_;
  auVar88._12_2_ = auVar86._14_2_;
  auVar88._0_12_ = auVar76;
  auVar88._14_2_ = auVar120._14_2_;
  uVar54 = CONCAT22(auVar148._8_2_,auVar62._8_2_);
  auVar57._0_8_ = CONCAT26(auVar150._10_2_,CONCAT24(auVar64._10_2_,uVar54));
  auVar57._8_2_ = auVar66._12_2_;
  auVar57._10_2_ = auVar152._12_2_;
  auVar69._12_2_ = auVar67._14_2_;
  auVar69._0_12_ = auVar57;
  auVar69._14_2_ = auVar153._14_2_;
  uVar94 = CONCAT22(auVar162._8_2_,auVar132._8_2_);
  auVar127._0_8_ = CONCAT26(auVar164._10_2_,CONCAT24(auVar134._10_2_,uVar94));
  auVar127._8_2_ = auVar136._12_2_;
  auVar127._10_2_ = auVar166._12_2_;
  auVar139._12_2_ = auVar137._14_2_;
  auVar139._0_12_ = auVar127;
  auVar139._14_2_ = auVar167._14_2_;
  auVar106._8_4_ = (int)((ulong)auVar38._0_8_ >> 0x20);
  auVar106._0_8_ = auVar38._0_8_;
  auVar106._12_4_ = (int)((ulong)auVar76._0_8_ >> 0x20);
  auVar89._8_4_ = (int)((ulong)auVar57._0_8_ >> 0x20);
  auVar89._0_8_ = auVar57._0_8_;
  auVar89._12_4_ = (int)((ulong)auVar127._0_8_ >> 0x20);
  d[4][0] = CONCAT44(uVar73,uVar35);
  d[4][1] = CONCAT44(uVar94,uVar54);
  d[5][0] = auVar106._8_8_;
  d[5][1] = auVar89._8_8_;
  *(int *)d[6] = auVar38._8_4_;
  *(int *)((long)d[6] + 4) = auVar76._8_4_;
  *(int *)(d[6] + 1) = auVar57._8_4_;
  *(int *)((long)d[6] + 0xc) = auVar127._8_4_;
  *(int *)(d[7] + 1) = auVar50._12_4_;
  *(int *)((long)d[7] + 0xc) = auVar88._12_4_;
  *(int *)d[8] = auVar69._12_4_;
  *(int *)((long)d[8] + 4) = auVar139._12_4_;
  uVar34 = CONCAT11((char)x[1][1],(char)(*x)[1]);
  uVar35 = CONCAT13(*(undefined1 *)((long)x[1] + 9),CONCAT12(*(undefined1 *)((long)*x + 9),uVar34));
  uVar36 = CONCAT15(*(undefined1 *)((long)x[1] + 10),CONCAT14(*(undefined1 *)((long)*x + 10),uVar35)
                   );
  uVar37 = CONCAT17(*(undefined1 *)((long)x[1] + 0xb),
                    CONCAT16(*(undefined1 *)((long)*x + 0xb),uVar36));
  auVar39._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[1] + 0xc),CONCAT18(*(undefined1 *)((long)*x + 0xc),uVar37));
  auVar39[10] = *(undefined1 *)((long)*x + 0xd);
  auVar39[0xb] = *(undefined1 *)((long)x[1] + 0xd);
  auVar41[0xc] = *(undefined1 *)((long)*x + 0xe);
  auVar41._0_12_ = auVar39;
  auVar41[0xd] = *(undefined1 *)((long)x[1] + 0xe);
  auVar51[0xe] = *(undefined1 *)((long)*x + 0xf);
  auVar51._0_14_ = auVar41;
  auVar51[0xf] = *(undefined1 *)((long)x[1] + 0xf);
  uVar93 = CONCAT11((char)x[3][1],(char)x[2][1]);
  uVar94 = CONCAT13(*(undefined1 *)((long)x[3] + 9),CONCAT12(*(undefined1 *)((long)x[2] + 9),uVar93)
                   );
  uVar95 = CONCAT15(*(undefined1 *)((long)x[3] + 10),
                    CONCAT14(*(undefined1 *)((long)x[2] + 10),uVar94));
  uVar96 = CONCAT17(*(undefined1 *)((long)x[3] + 0xb),
                    CONCAT16(*(undefined1 *)((long)x[2] + 0xb),uVar95));
  auVar97._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[3] + 0xc),CONCAT18(*(undefined1 *)((long)x[2] + 0xc),uVar96)
               );
  auVar97[10] = *(undefined1 *)((long)x[2] + 0xd);
  auVar97[0xb] = *(undefined1 *)((long)x[3] + 0xd);
  auVar98[0xc] = *(undefined1 *)((long)x[2] + 0xe);
  auVar98._0_12_ = auVar97;
  auVar98[0xd] = *(undefined1 *)((long)x[3] + 0xe);
  auVar107[0xe] = *(undefined1 *)((long)x[2] + 0xf);
  auVar107._0_14_ = auVar98;
  auVar107[0xf] = *(undefined1 *)((long)x[3] + 0xf);
  uVar72 = CONCAT11((char)x[5][1],(char)x[4][1]);
  uVar73 = CONCAT13(*(undefined1 *)((long)x[5] + 9),CONCAT12(*(undefined1 *)((long)x[4] + 9),uVar72)
                   );
  uVar74 = CONCAT15(*(undefined1 *)((long)x[5] + 10),
                    CONCAT14(*(undefined1 *)((long)x[4] + 10),uVar73));
  uVar75 = CONCAT17(*(undefined1 *)((long)x[5] + 0xb),
                    CONCAT16(*(undefined1 *)((long)x[4] + 0xb),uVar74));
  auVar77._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[5] + 0xc),CONCAT18(*(undefined1 *)((long)x[4] + 0xc),uVar75)
               );
  auVar77[10] = *(undefined1 *)((long)x[4] + 0xd);
  auVar77[0xb] = *(undefined1 *)((long)x[5] + 0xd);
  auVar79[0xc] = *(undefined1 *)((long)x[4] + 0xe);
  auVar79._0_12_ = auVar77;
  auVar79[0xd] = *(undefined1 *)((long)x[5] + 0xe);
  auVar90[0xe] = *(undefined1 *)((long)x[4] + 0xf);
  auVar90._0_14_ = auVar79;
  auVar90[0xf] = *(undefined1 *)((long)x[5] + 0xf);
  uVar109 = CONCAT11((char)x[7][1],(char)x[6][1]);
  uVar110 = CONCAT13(*(undefined1 *)((long)x[7] + 9),
                     CONCAT12(*(undefined1 *)((long)x[6] + 9),uVar109));
  uVar111 = CONCAT15(*(undefined1 *)((long)x[7] + 10),
                     CONCAT14(*(undefined1 *)((long)x[6] + 10),uVar110));
  uVar112 = CONCAT17(*(undefined1 *)((long)x[7] + 0xb),
                     CONCAT16(*(undefined1 *)((long)x[6] + 0xb),uVar111));
  auVar113._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[7] + 0xc),
                CONCAT18(*(undefined1 *)((long)x[6] + 0xc),uVar112));
  auVar113[10] = *(undefined1 *)((long)x[6] + 0xd);
  auVar113[0xb] = *(undefined1 *)((long)x[7] + 0xd);
  auVar114[0xc] = *(undefined1 *)((long)x[6] + 0xe);
  auVar114._0_12_ = auVar113;
  auVar114[0xd] = *(undefined1 *)((long)x[7] + 0xe);
  auVar122[0xe] = *(undefined1 *)((long)x[6] + 0xf);
  auVar122._0_14_ = auVar114;
  auVar122[0xf] = *(undefined1 *)((long)x[7] + 0xf);
  uVar53 = CONCAT11((char)x[9][1],(char)x[8][1]);
  uVar54 = CONCAT13(*(undefined1 *)((long)x[9] + 9),CONCAT12(*(undefined1 *)((long)x[8] + 9),uVar53)
                   );
  uVar55 = CONCAT15(*(undefined1 *)((long)x[9] + 10),
                    CONCAT14(*(undefined1 *)((long)x[8] + 10),uVar54));
  uVar56 = CONCAT17(*(undefined1 *)((long)x[9] + 0xb),
                    CONCAT16(*(undefined1 *)((long)x[8] + 0xb),uVar55));
  auVar58._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[9] + 0xc),CONCAT18(*(undefined1 *)((long)x[8] + 0xc),uVar56)
               );
  auVar58[10] = *(undefined1 *)((long)x[8] + 0xd);
  auVar58[0xb] = *(undefined1 *)((long)x[9] + 0xd);
  auVar60[0xc] = *(undefined1 *)((long)x[8] + 0xe);
  auVar60._0_12_ = auVar58;
  auVar60[0xd] = *(undefined1 *)((long)x[9] + 0xe);
  auVar70[0xe] = *(undefined1 *)((long)x[8] + 0xf);
  auVar70._0_14_ = auVar60;
  auVar70[0xf] = *(undefined1 *)((long)x[9] + 0xf);
  uVar142 = CONCAT11((char)x[0xb][1],(char)x[10][1]);
  uVar143 = CONCAT13(*(undefined1 *)((long)x[0xb] + 9),
                     CONCAT12(*(undefined1 *)((long)x[10] + 9),uVar142));
  uVar144 = CONCAT15(*(undefined1 *)((long)x[0xb] + 10),
                     CONCAT14(*(undefined1 *)((long)x[10] + 10),uVar143));
  uVar145 = CONCAT17(*(undefined1 *)((long)x[0xb] + 0xb),
                     CONCAT16(*(undefined1 *)((long)x[10] + 0xb),uVar144));
  auVar146._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[0xb] + 0xc),
                CONCAT18(*(undefined1 *)((long)x[10] + 0xc),uVar145));
  auVar146[10] = *(undefined1 *)((long)x[10] + 0xd);
  auVar146[0xb] = *(undefined1 *)((long)x[0xb] + 0xd);
  auVar147[0xc] = *(undefined1 *)((long)x[10] + 0xe);
  auVar147._0_12_ = auVar146;
  auVar147[0xd] = *(undefined1 *)((long)x[0xb] + 0xe);
  auVar155[0xe] = *(undefined1 *)((long)x[10] + 0xf);
  auVar155._0_14_ = auVar147;
  auVar155[0xf] = *(undefined1 *)((long)x[0xb] + 0xf);
  uVar123 = CONCAT11((char)x[0xd][1],(char)x[0xc][1]);
  uVar124 = CONCAT13(*(undefined1 *)((long)x[0xd] + 9),
                     CONCAT12(*(undefined1 *)((long)x[0xc] + 9),uVar123));
  uVar125 = CONCAT15(*(undefined1 *)((long)x[0xd] + 10),
                     CONCAT14(*(undefined1 *)((long)x[0xc] + 10),uVar124));
  uVar126 = CONCAT17(*(undefined1 *)((long)x[0xd] + 0xb),
                     CONCAT16(*(undefined1 *)((long)x[0xc] + 0xb),uVar125));
  auVar128._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[0xd] + 0xc),
                CONCAT18(*(undefined1 *)((long)x[0xc] + 0xc),uVar126));
  auVar128[10] = *(undefined1 *)((long)x[0xc] + 0xd);
  auVar128[0xb] = *(undefined1 *)((long)x[0xd] + 0xd);
  auVar130[0xc] = *(undefined1 *)((long)x[0xc] + 0xe);
  auVar130._0_12_ = auVar128;
  auVar130[0xd] = *(undefined1 *)((long)x[0xd] + 0xe);
  auVar140[0xe] = *(undefined1 *)((long)x[0xc] + 0xf);
  auVar140._0_14_ = auVar130;
  auVar140[0xf] = *(undefined1 *)((long)x[0xd] + 0xf);
  uVar156 = CONCAT11((char)x[0xf][1],(char)x[0xe][1]);
  uVar157 = CONCAT13(*(undefined1 *)((long)x[0xf] + 9),
                     CONCAT12(*(undefined1 *)((long)x[0xe] + 9),uVar156));
  uVar158 = CONCAT15(*(undefined1 *)((long)x[0xf] + 10),
                     CONCAT14(*(undefined1 *)((long)x[0xe] + 10),uVar157));
  uVar159 = CONCAT17(*(undefined1 *)((long)x[0xf] + 0xb),
                     CONCAT16(*(undefined1 *)((long)x[0xe] + 0xb),uVar158));
  auVar160._0_10_ =
       CONCAT19(*(undefined1 *)((long)x[0xf] + 0xc),
                CONCAT18(*(undefined1 *)((long)x[0xe] + 0xc),uVar159));
  auVar160[10] = *(undefined1 *)((long)x[0xe] + 0xd);
  auVar160[0xb] = *(undefined1 *)((long)x[0xf] + 0xd);
  auVar161[0xc] = *(undefined1 *)((long)x[0xe] + 0xe);
  auVar161._0_12_ = auVar160;
  auVar161[0xd] = *(undefined1 *)((long)x[0xf] + 0xe);
  auVar169[0xe] = *(undefined1 *)((long)x[0xe] + 0xf);
  auVar169._0_14_ = auVar161;
  auVar169[0xf] = *(undefined1 *)((long)x[0xf] + 0xf);
  auVar179._12_2_ = (short)((ulong)uVar37 >> 0x30);
  auVar179._0_12_ = auVar39;
  auVar179._14_2_ = (short)((ulong)uVar96 >> 0x30);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._10_2_ = (short)((uint6)uVar95 >> 0x20);
  auVar178._0_10_ = auVar39._0_10_;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = (short)((uint6)uVar36 >> 0x20);
  auVar177._0_8_ = uVar37;
  auVar176._8_8_ = auVar177._8_8_;
  auVar176._6_2_ = (short)((uint)uVar94 >> 0x10);
  auVar176._0_6_ = uVar36;
  auVar175._6_10_ = auVar176._6_10_;
  auVar175._4_2_ = (short)((uint)uVar35 >> 0x10);
  auVar175._0_4_ = uVar35;
  auVar174._4_12_ = auVar175._4_12_;
  auVar174._0_4_ = CONCAT22(uVar93,uVar34);
  auVar188._12_2_ = (short)((ulong)uVar75 >> 0x30);
  auVar188._0_12_ = auVar77;
  auVar188._14_2_ = (short)((ulong)uVar112 >> 0x30);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._10_2_ = (short)((uint6)uVar111 >> 0x20);
  auVar187._0_10_ = auVar77._0_10_;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = (short)((uint6)uVar74 >> 0x20);
  auVar186._0_8_ = uVar75;
  auVar185._8_8_ = auVar186._8_8_;
  auVar185._6_2_ = (short)((uint)uVar110 >> 0x10);
  auVar185._0_6_ = uVar74;
  auVar184._6_10_ = auVar185._6_10_;
  auVar184._4_2_ = (short)((uint)uVar73 >> 0x10);
  auVar184._0_4_ = uVar73;
  auVar199._12_2_ = (short)((ulong)uVar56 >> 0x30);
  auVar199._0_12_ = auVar58;
  auVar199._14_2_ = (short)((ulong)uVar145 >> 0x30);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._10_2_ = (short)((uint6)uVar144 >> 0x20);
  auVar198._0_10_ = auVar58._0_10_;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = (short)((uint6)uVar55 >> 0x20);
  auVar197._0_8_ = uVar56;
  auVar196._8_8_ = auVar197._8_8_;
  auVar196._6_2_ = (short)((uint)uVar143 >> 0x10);
  auVar196._0_6_ = uVar55;
  auVar195._6_10_ = auVar196._6_10_;
  auVar195._4_2_ = (short)((uint)uVar54 >> 0x10);
  auVar195._0_4_ = uVar54;
  auVar194._4_12_ = auVar195._4_12_;
  auVar194._0_4_ = CONCAT22(uVar142,uVar53);
  auVar207._12_2_ = (short)((ulong)uVar126 >> 0x30);
  auVar207._0_12_ = auVar128;
  auVar207._14_2_ = (short)((ulong)uVar159 >> 0x30);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._10_2_ = (short)((uint6)uVar158 >> 0x20);
  auVar206._0_10_ = auVar128._0_10_;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = (short)((uint6)uVar125 >> 0x20);
  auVar205._0_8_ = uVar126;
  auVar204._8_8_ = auVar205._8_8_;
  auVar204._6_2_ = (short)((uint)uVar157 >> 0x10);
  auVar204._0_6_ = uVar125;
  auVar203._6_10_ = auVar204._6_10_;
  auVar203._4_2_ = (short)((uint)uVar124 >> 0x10);
  auVar203._0_4_ = uVar124;
  auVar209._0_8_ = auVar174._0_8_;
  auVar209._8_4_ = auVar175._4_4_;
  auVar209._12_4_ = auVar184._4_4_;
  auVar189._0_8_ = auVar194._0_8_;
  auVar189._8_4_ = auVar195._4_4_;
  auVar189._12_4_ = auVar203._4_4_;
  d[8][0] = CONCAT44(CONCAT22(uVar109,uVar72),auVar174._0_4_);
  d[8][1] = CONCAT44(CONCAT22(uVar156,uVar123),auVar194._0_4_);
  d[9][0] = auVar209._8_8_;
  d[9][1] = auVar189._8_8_;
  *(int *)d[10] = auVar177._8_4_;
  *(int *)((long)d[10] + 4) = auVar186._8_4_;
  *(int *)(d[10] + 1) = auVar197._8_4_;
  *(int *)((long)d[10] + 0xc) = auVar205._8_4_;
  *(undefined4 *)(d[0xb] + 1) = auVar178._12_4_;
  *(undefined4 *)((long)d[0xb] + 0xc) = auVar187._12_4_;
  *(undefined4 *)d[0xc] = auVar198._12_4_;
  *(undefined4 *)((long)d[0xc] + 4) = auVar206._12_4_;
  uVar35 = CONCAT22((short)((unkuint10)auVar97._0_10_ >> 0x40),
                    (short)((unkuint10)auVar39._0_10_ >> 0x40));
  auVar40._0_8_ = CONCAT26(auVar97._10_2_,CONCAT24(auVar39._10_2_,uVar35));
  auVar40._8_2_ = auVar41._12_2_;
  auVar40._10_2_ = auVar98._12_2_;
  auVar52._12_2_ = auVar51._14_2_;
  auVar52._0_12_ = auVar40;
  auVar52._14_2_ = auVar107._14_2_;
  uVar73 = CONCAT22((short)((unkuint10)auVar113._0_10_ >> 0x40),
                    (short)((unkuint10)auVar77._0_10_ >> 0x40));
  auVar78._0_8_ = CONCAT26(auVar113._10_2_,CONCAT24(auVar77._10_2_,uVar73));
  auVar78._8_2_ = auVar79._12_2_;
  auVar78._10_2_ = auVar114._12_2_;
  auVar91._12_2_ = auVar90._14_2_;
  auVar91._0_12_ = auVar78;
  auVar91._14_2_ = auVar122._14_2_;
  uVar54 = CONCAT22((short)((unkuint10)auVar146._0_10_ >> 0x40),
                    (short)((unkuint10)auVar58._0_10_ >> 0x40));
  auVar59._0_8_ = CONCAT26(auVar146._10_2_,CONCAT24(auVar58._10_2_,uVar54));
  auVar59._8_2_ = auVar60._12_2_;
  auVar59._10_2_ = auVar147._12_2_;
  auVar71._12_2_ = auVar70._14_2_;
  auVar71._0_12_ = auVar59;
  auVar71._14_2_ = auVar155._14_2_;
  uVar94 = CONCAT22((short)((unkuint10)auVar160._0_10_ >> 0x40),
                    (short)((unkuint10)auVar128._0_10_ >> 0x40));
  auVar129._0_8_ = CONCAT26(auVar160._10_2_,CONCAT24(auVar128._10_2_,uVar94));
  auVar129._8_2_ = auVar130._12_2_;
  auVar129._10_2_ = auVar161._12_2_;
  auVar141._12_2_ = auVar140._14_2_;
  auVar141._0_12_ = auVar129;
  auVar141._14_2_ = auVar169._14_2_;
  auVar108._8_4_ = (int)((ulong)auVar40._0_8_ >> 0x20);
  auVar108._0_8_ = auVar40._0_8_;
  auVar108._12_4_ = (int)((ulong)auVar78._0_8_ >> 0x20);
  auVar92._8_4_ = (int)((ulong)auVar59._0_8_ >> 0x20);
  auVar92._0_8_ = auVar59._0_8_;
  auVar92._12_4_ = (int)((ulong)auVar129._0_8_ >> 0x20);
  d[0xc][0] = CONCAT44(uVar73,uVar35);
  d[0xc][1] = CONCAT44(uVar94,uVar54);
  d[0xd][0] = auVar108._8_8_;
  d[0xd][1] = auVar92._8_8_;
  *(int *)d[0xe] = auVar40._8_4_;
  *(int *)((long)d[0xe] + 4) = auVar78._8_4_;
  *(int *)(d[0xe] + 1) = auVar59._8_4_;
  *(int *)((long)d[0xe] + 0xc) = auVar129._8_4_;
  *(int *)(d[0xf] + 1) = auVar52._12_4_;
  *(int *)((long)d[0xf] + 0xc) = auVar91._12_4_;
  *(int *)d[0x10] = auVar71._12_4_;
  *(int *)((long)d[0x10] + 4) = auVar141._12_4_;
  return;
}

Assistant:

static inline void transpose16x16_sse2(__m128i *x, __m128i *d) {
  __m128i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9;
  __m128i w10, w11, w12, w13, w14, w15;

  w0 = _mm_unpacklo_epi8(x[0], x[1]);
  w1 = _mm_unpacklo_epi8(x[2], x[3]);
  w2 = _mm_unpacklo_epi8(x[4], x[5]);
  w3 = _mm_unpacklo_epi8(x[6], x[7]);

  w8 = _mm_unpacklo_epi8(x[8], x[9]);
  w9 = _mm_unpacklo_epi8(x[10], x[11]);
  w10 = _mm_unpacklo_epi8(x[12], x[13]);
  w11 = _mm_unpacklo_epi8(x[14], x[15]);

  w4 = _mm_unpacklo_epi16(w0, w1);
  w5 = _mm_unpacklo_epi16(w2, w3);
  w12 = _mm_unpacklo_epi16(w8, w9);
  w13 = _mm_unpacklo_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[0] = _mm_unpacklo_epi64(w6, w14);
  d[1] = _mm_unpackhi_epi64(w6, w14);
  d[2] = _mm_unpacklo_epi64(w7, w15);
  d[3] = _mm_unpackhi_epi64(w7, w15);

  w4 = _mm_unpackhi_epi16(w0, w1);
  w5 = _mm_unpackhi_epi16(w2, w3);
  w12 = _mm_unpackhi_epi16(w8, w9);
  w13 = _mm_unpackhi_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[4] = _mm_unpacklo_epi64(w6, w14);
  d[5] = _mm_unpackhi_epi64(w6, w14);
  d[6] = _mm_unpacklo_epi64(w7, w15);
  d[7] = _mm_unpackhi_epi64(w7, w15);

  // upper half
  w0 = _mm_unpackhi_epi8(x[0], x[1]);
  w1 = _mm_unpackhi_epi8(x[2], x[3]);
  w2 = _mm_unpackhi_epi8(x[4], x[5]);
  w3 = _mm_unpackhi_epi8(x[6], x[7]);

  w8 = _mm_unpackhi_epi8(x[8], x[9]);
  w9 = _mm_unpackhi_epi8(x[10], x[11]);
  w10 = _mm_unpackhi_epi8(x[12], x[13]);
  w11 = _mm_unpackhi_epi8(x[14], x[15]);

  w4 = _mm_unpacklo_epi16(w0, w1);
  w5 = _mm_unpacklo_epi16(w2, w3);
  w12 = _mm_unpacklo_epi16(w8, w9);
  w13 = _mm_unpacklo_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[8] = _mm_unpacklo_epi64(w6, w14);
  d[9] = _mm_unpackhi_epi64(w6, w14);
  d[10] = _mm_unpacklo_epi64(w7, w15);
  d[11] = _mm_unpackhi_epi64(w7, w15);

  w4 = _mm_unpackhi_epi16(w0, w1);
  w5 = _mm_unpackhi_epi16(w2, w3);
  w12 = _mm_unpackhi_epi16(w8, w9);
  w13 = _mm_unpackhi_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[12] = _mm_unpacklo_epi64(w6, w14);
  d[13] = _mm_unpackhi_epi64(w6, w14);
  d[14] = _mm_unpacklo_epi64(w7, w15);
  d[15] = _mm_unpackhi_epi64(w7, w15);
}